

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O2

SPxId __thiscall soplex::SPxDevexPR<double>::selectEnterX(SPxDevexPR<double> *this,double tol)

{
  SPxSolverBase<double> *pSVar1;
  DataKey DVar2;
  DataKey DVar3;
  double bestCo;
  double best;
  double local_18;
  
  best = 0.0;
  bestCo = 0.0;
  this->last = 1.0;
  pSVar1 = (this->super_SPxPricer<double>).thesolver;
  local_18 = tol;
  if ((pSVar1->hyperPricingEnter == true) && (this->refined == false)) {
    if (((this->bestPrices).super_IdxSet.num < 2) ||
       ((pSVar1->super_SPxBasisBase<double>).updateCount == 0)) {
      if (pSVar1->sparsePricingEnter != true) goto LAB_001cbebc;
      DVar2 = (DataKey)buildBestPriceVectorEnterDim(this,&best,tol);
    }
    else if (pSVar1->sparsePricingEnter == true) {
      DVar2 = (DataKey)selectEnterHyperDim(this,&best,tol);
    }
    else {
LAB_001cbebc:
      DVar2 = (DataKey)selectEnterDenseDim(this,&best,tol,0,1);
    }
    pSVar1 = (this->super_SPxPricer<double>).thesolver;
    if (((this->bestPricesCo).super_IdxSet.num < 2) ||
       ((pSVar1->super_SPxBasisBase<double>).updateCount == 0)) {
      if (pSVar1->sparsePricingEnterCo == true) {
        DVar3 = (DataKey)buildBestPriceVectorEnterCoDim(this,&bestCo,local_18);
        goto LAB_001cbf1d;
      }
    }
    else if (pSVar1->sparsePricingEnterCo == true) {
      DVar3 = (DataKey)selectEnterHyperCoDim(this,&bestCo,local_18);
      goto LAB_001cbf1d;
    }
  }
  else {
    if ((pSVar1->sparsePricingEnter == true) && (this->refined == false)) {
      DVar2 = (DataKey)selectEnterSparseDim(this,&best,tol);
    }
    else {
      DVar2 = (DataKey)selectEnterDenseDim(this,&best,tol,0,1);
    }
    if ((((this->super_SPxPricer<double>).thesolver)->sparsePricingEnterCo == true) &&
       (this->refined == false)) {
      DVar3 = (DataKey)selectEnterSparseCoDim(this,&bestCo,local_18);
      goto LAB_001cbf1d;
    }
  }
  DVar3 = (DataKey)selectEnterDenseCoDim(this,&bestCo,local_18,0,1);
LAB_001cbf1d:
  if ((DVar2.info == 0) || ((best <= bestCo * 0.8 && (((ulong)DVar3 & 0xffffffff) != 0)))) {
    DVar2 = DVar3;
  }
  return (SPxId)DVar2;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnterX(R tol)
{
   SPxId enterId;
   SPxId enterCoId;
   R best;
   R bestCo;

   best = 0;
   bestCo = 0;
   last = 1.0;

   // avoid uninitialized value later on in entered4X()
   last = 1.0;

   if(this->thesolver->hyperPricingEnter && !refined)
   {
      if(bestPrices.size() < 2 || this->thesolver->basis().lastUpdate() == 0)
         enterCoId = (this->thesolver->sparsePricingEnter) ? buildBestPriceVectorEnterDim(best,
                     tol) : selectEnterDenseDim(best, tol);
      else
         enterCoId = (this->thesolver->sparsePricingEnter) ? selectEnterHyperDim(best,
                     tol) : selectEnterDenseDim(best, tol);

      if(bestPricesCo.size() < 2 || this->thesolver->basis().lastUpdate() == 0)
         enterId = (this->thesolver->sparsePricingEnterCo) ? buildBestPriceVectorEnterCoDim(bestCo,
                   tol) : selectEnterDenseCoDim(bestCo, tol);
      else
         enterId = (this->thesolver->sparsePricingEnterCo) ? selectEnterHyperCoDim(bestCo,
                   tol) : selectEnterDenseCoDim(bestCo, tol);
   }
   else
   {
      enterCoId = (this->thesolver->sparsePricingEnter
                   && !refined) ? selectEnterSparseDim(best, tol) : selectEnterDenseDim(best, tol);
      enterId = (this->thesolver->sparsePricingEnterCo
                 && !refined) ? selectEnterSparseCoDim(bestCo, tol) : selectEnterDenseCoDim(bestCo, tol);
   }

   // prefer coIds to increase the number of unit vectors in the basis matrix, i.e., rows in colrep and cols in rowrep
   if(enterCoId.isValid() && (best > SOPLEX_SPARSITY_TRADEOFF * bestCo || !enterId.isValid()))
      return enterCoId;
   else
      return enterId;
}